

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O3

void ot::commissioner::CommissionerApp::MergeDataset
               (CommissionerDataset *aDst,CommissionerDataset *aSrc)

{
  byte *pbVar1;
  ushort uVar2;
  
  uVar2 = aSrc->mPresentFlags;
  if ((short)uVar2 < 0) {
    aDst->mBorderAgentLocator = aSrc->mBorderAgentLocator;
    pbVar1 = (byte *)((long)&aDst->mPresentFlags + 1);
    *pbVar1 = *pbVar1 | 0x80;
    uVar2 = aSrc->mPresentFlags;
  }
  if ((uVar2 >> 0xe & 1) != 0) {
    aDst->mSessionId = aSrc->mSessionId;
    pbVar1 = (byte *)((long)&aDst->mPresentFlags + 1);
    *pbVar1 = *pbVar1 | 0x40;
    uVar2 = aSrc->mPresentFlags;
  }
  if ((uVar2 >> 0xd & 1) == 0) {
    uVar2 = aDst->mPresentFlags & 0xdfff;
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&aDst->mSteeringData,&aSrc->mSteeringData);
    uVar2 = aDst->mPresentFlags | 0x2000;
  }
  aDst->mPresentFlags = uVar2;
  if ((aSrc->mPresentFlags & 0x1000) == 0) {
    uVar2 = uVar2 & 0xefff;
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&aDst->mAeSteeringData,&aSrc->mAeSteeringData);
    uVar2 = aDst->mPresentFlags | 0x1000;
  }
  aDst->mPresentFlags = uVar2;
  if ((aSrc->mPresentFlags & 0x800) == 0) {
    uVar2 = uVar2 & 0xf7ff;
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (&aDst->mNmkpSteeringData,&aSrc->mNmkpSteeringData);
    uVar2 = aDst->mPresentFlags | 0x800;
  }
  aDst->mPresentFlags = uVar2;
  if ((aSrc->mPresentFlags & 0x400) == 0) {
    uVar2 = uVar2 & 0xfbff;
  }
  else {
    aDst->mJoinerUdpPort = aSrc->mJoinerUdpPort;
    uVar2 = uVar2 | 0x400;
  }
  aDst->mPresentFlags = uVar2;
  if ((aSrc->mPresentFlags & 0x200) == 0) {
    uVar2 = uVar2 & 0xfdff;
  }
  else {
    aDst->mAeUdpPort = aSrc->mAeUdpPort;
    uVar2 = uVar2 | 0x200;
  }
  aDst->mPresentFlags = uVar2;
  if ((aSrc->mPresentFlags & 0x100) == 0) {
    uVar2 = uVar2 & 0xfeff;
  }
  else {
    aDst->mNmkpUdpPort = aSrc->mNmkpUdpPort;
    uVar2 = uVar2 | 0x100;
  }
  aDst->mPresentFlags = uVar2;
  return;
}

Assistant:

void CommissionerApp::MergeDataset(CommissionerDataset &aDst, const CommissionerDataset &aSrc)
{
#define SET_IF_PRESENT(name)                                     \
    if (aSrc.mPresentFlags & CommissionerDataset::k##name##Bit)  \
    {                                                            \
        aDst.m##name = aSrc.m##name;                             \
        aDst.mPresentFlags |= CommissionerDataset::k##name##Bit; \
    }

    SET_IF_PRESENT(BorderAgentLocator);
    SET_IF_PRESENT(SessionId);

#undef SET_IF_PRESENT
#define SET_IF_PRESENT(name)                                      \
    if (aSrc.mPresentFlags & CommissionerDataset::k##name##Bit)   \
    {                                                             \
        aDst.m##name = aSrc.m##name;                              \
        aDst.mPresentFlags |= CommissionerDataset::k##name##Bit;  \
    }                                                             \
    else                                                          \
    {                                                             \
        aDst.mPresentFlags &= ~CommissionerDataset::k##name##Bit; \
    }

    SET_IF_PRESENT(SteeringData);
    SET_IF_PRESENT(AeSteeringData);
    SET_IF_PRESENT(NmkpSteeringData);
    SET_IF_PRESENT(JoinerUdpPort);
    SET_IF_PRESENT(AeUdpPort);
    SET_IF_PRESENT(NmkpUdpPort);

#undef SET_IF_PRESENT
}